

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O0

bool __thiscall RenX::Server::setUUIDIfDifferent(Server *this,PlayerInfo *player,string_view uuid)

{
  bool bVar1;
  __sv_type __y;
  PlayerInfo *player_local;
  Server *this_local;
  string_view uuid_local;
  
  __y = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&player->uuid);
  bVar1 = std::operator==(uuid,__y);
  if (!bVar1) {
    setUUID(this,player,uuid);
  }
  uuid_local._M_str._7_1_ = !bVar1;
  return uuid_local._M_str._7_1_;
}

Assistant:

bool RenX::Server::setUUIDIfDifferent(RenX::PlayerInfo &player, std::string_view uuid) {
	if (player.uuid == uuid) {
		return false;
	}

	setUUID(player, uuid);
	return true;
}